

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_ycbcr_conversion
          (Impl *this,VkSamplerYcbcrConversionCreateInfo *create_info,ScratchAllocator *alloc,
          VkSamplerYcbcrConversionCreateInfo **out_info)

{
  void *pvVar1;
  VkSamplerYcbcrConversionCreateInfo *pVVar2;
  
  pVVar2 = copy<VkSamplerYcbcrConversionCreateInfo>(this,create_info,1,alloc);
  pvVar1 = create_info->pNext;
  if (pvVar1 == (void *)0x0) {
    *out_info = pVVar2;
  }
  return pvVar1 == (void *)0x0;
}

Assistant:

bool StateRecorder::Impl::copy_ycbcr_conversion(const VkSamplerYcbcrConversionCreateInfo *create_info,
                                                ScratchAllocator &alloc, VkSamplerYcbcrConversionCreateInfo **out_info)
{
	auto *info = copy(create_info, 1, alloc);

	// Don't support pNext in this struct.
	if (create_info->pNext)
		return false;

	*out_info = info;
	return true;
}